

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# other-tests.cpp
# Opt level: O2

int homoMatrixDerivationTestFromFile(char *homo,char *vel,string *prefix)

{
  double dVar1;
  TimeIndex TVar2;
  DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *pDVar3;
  ostream *poVar4;
  Matrix<double,__1,__1,_0,__1,__1> *pMVar5;
  DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *pDVar6;
  Scalar *pSVar7;
  long j;
  long index;
  TimeIndex time;
  Matrix<double,__1,__1,_0,__1,__1> local_890;
  Matrix4 local_878;
  IndexedMatrixArray homoMatrices;
  IndexedMatrixArray computedVelocities;
  IndexedMatrixArray velocities;
  Vector6 local_6e8;
  Matrix4 local_6b8;
  ofstream f2;
  ofstream f1;
  ofstream f;
  
  stateObservation::
  IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::IndexedMatrixArrayT(&velocities);
  stateObservation::
  IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::readFromFile(&velocities,vel,6,1,true);
  stateObservation::
  IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::IndexedMatrixArrayT(&homoMatrices);
  stateObservation::
  IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::readFromFile(&homoMatrices,homo,4,4,true);
  stateObservation::
  IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::IndexedMatrixArrayT(&computedVelocities);
  std::ofstream::ofstream(&f);
  std::ofstream::ofstream(&f1);
  std::ofstream::ofstream(&f2);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_878,
                 prefix,"output.dat");
  std::ofstream::open((char *)&f,
                      SUB84(local_878.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                            m_storage.m_data.array[0],0));
  std::__cxx11::string::~string((string *)&local_878);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_878,
                 prefix,"computed.dat");
  std::ofstream::open((char *)&f1,
                      SUB84(local_878.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                            m_storage.m_data.array[0],0));
  std::__cxx11::string::~string((string *)&local_878);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_878,
                 prefix,"real.dat");
  std::ofstream::open((char *)&f2,
                      SUB84(local_878.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                            m_storage.m_data.array[0],0));
  std::__cxx11::string::~string((string *)&local_878);
  time = homoMatrices.k_;
  while( true ) {
    TVar2 = stateObservation::
            IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
            ::getLastIndex(&homoMatrices);
    if (TVar2 <= time) break;
    pDVar3 = (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
             stateObservation::
             IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
             ::operator[](&homoMatrices,time);
    Eigen::PlainObjectBase<Eigen::Matrix<double,4,4,0,4,4>>::
    PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>>
              ((PlainObjectBase<Eigen::Matrix<double,4,4,0,4,4>> *)&local_878,pDVar3);
    pDVar3 = (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
             stateObservation::
             IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
             ::operator[](&homoMatrices,time + 1);
    Eigen::PlainObjectBase<Eigen::Matrix<double,4,4,0,4,4>>::
    PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>>
              ((PlainObjectBase<Eigen::Matrix<double,4,4,0,4,4>> *)&local_6b8,pDVar3);
    stateObservation::kine::derivateHomogeneousMatrixFD(&local_6e8,&local_878,&local_6b8,0.005);
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
    PlainObjectBase<Eigen::Matrix<double,6,1,0,6,1>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_890,
               (DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)&local_6e8);
    stateObservation::
    IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
    ::setValue(&computedVelocities,&local_890,time);
    free(local_890.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
        );
    poVar4 = std::ostream::_M_insert<long>((long)&f);
    std::operator<<(poVar4," \t ");
    index = 0;
    while( true ) {
      pMVar5 = stateObservation::
               IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
               ::operator[](&computedVelocities,time);
      if ((pMVar5->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
          m_rows <= index) break;
      std::operator<<((ostream *)&f," ");
      pDVar6 = (DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
               stateObservation::
               IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
               ::operator[](&computedVelocities,time);
      pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                         (pDVar6,index);
      dVar1 = *pSVar7;
      pDVar6 = (DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
               stateObservation::
               IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
               ::operator[](&velocities,time);
      pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                         (pDVar6,index);
      std::ostream::_M_insert<double>(dVar1 - *pSVar7);
      index = index + 1;
    }
    std::endl<char,std::char_traits<char>>((ostream *)&f);
    poVar4 = std::ostream::_M_insert<long>((long)&f1);
    poVar4 = std::operator<<(poVar4," \t ");
    local_878.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0]
         = (double)stateObservation::
                   IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
                   ::operator[](&computedVelocities,time);
    poVar4 = Eigen::operator<<(poVar4,(DenseBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                                       *)&local_878);
    std::endl<char,std::char_traits<char>>(poVar4);
    poVar4 = std::ostream::_M_insert<long>((long)&f2);
    poVar4 = std::operator<<(poVar4," \t ");
    local_878.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0]
         = (double)stateObservation::
                   IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
                   ::operator[](&velocities,time);
    poVar4 = Eigen::operator<<(poVar4,(DenseBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                                       *)&local_878);
    std::endl<char,std::char_traits<char>>(poVar4);
    time = time + 1;
  }
  std::ofstream::~ofstream(&f2);
  std::ofstream::~ofstream(&f1);
  std::ofstream::~ofstream(&f);
  std::
  deque<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::~deque(&computedVelocities.v_);
  std::
  deque<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::~deque(&homoMatrices.v_);
  std::
  deque<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::~deque(&velocities.v_);
  return 0;
}

Assistant:

int homoMatrixDerivationTestFromFile(char * homo, char * vel, const std::string & prefix)
{
  IndexedMatrixArray velocities;
  velocities.readFromFile(vel, 6);
  IndexedMatrixArray homoMatrices;
  homoMatrices.readFromFile(homo, 4, 4);

  IndexedMatrixArray computedVelocities;

  std::ofstream f, f1, f2;
  f.open((prefix + "output.dat").c_str());
  f1.open((prefix + "computed.dat").c_str());
  f2.open((prefix + "real.dat").c_str());

  for(TimeIndex i = homoMatrices.getFirstIndex(); i < homoMatrices.getLastIndex(); ++i)
  {
    computedVelocities.setValue(kine::derivateHomogeneousMatrixFD(homoMatrices[i], homoMatrices[i + 1], dt), i);

    f << i << " \t ";
    for(long j = 0; j < computedVelocities[i].rows(); ++j)
    {
      f << " " << computedVelocities[i](j) - velocities[i](j);
    }

    f << std::endl;

    f1 << i << " \t " << computedVelocities[i].transpose() << std::endl;
    f2 << i << " \t " << velocities[i].transpose() << std::endl;
  }

  return 0;
}